

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThreeBBShaft.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThreeBBShaft::SetVariables
          (ChConstraintThreeBBShaft *this,ChVariables *mvariables_a,ChVariables *mvariables_b,
          ChVariables *mvariables_c)

{
  long lVar1;
  bool bVar2;
  
  if (mvariables_a != (ChVariables *)0x0) {
    lVar1 = __dynamic_cast(mvariables_a,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
    if (lVar1 != 0) {
      if (mvariables_b != (ChVariables *)0x0) {
        lVar1 = __dynamic_cast(mvariables_b,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0);
        if (lVar1 != 0) {
          if (mvariables_c != (ChVariables *)0x0) {
            lVar1 = __dynamic_cast(mvariables_c,&ChVariables::typeinfo,&ChVariablesBody::typeinfo,0)
            ;
            if (lVar1 != 0) {
              (this->super_ChConstraintThree).super_ChConstraint.valid = true;
              if ((((this->super_ChConstraintThree).super_ChConstraint.disabled == false) &&
                  ((this->super_ChConstraintThree).super_ChConstraint.redundant == false)) &&
                 ((this->super_ChConstraintThree).super_ChConstraint.broken == false)) {
                bVar2 = (this->super_ChConstraintThree).super_ChConstraint.mode != CONSTRAINT_FREE;
              }
              else {
                bVar2 = false;
              }
              (this->super_ChConstraintThree).super_ChConstraint.active = bVar2;
              (this->super_ChConstraintThree).variables_a = mvariables_a;
              (this->super_ChConstraintThree).variables_b = mvariables_b;
              (this->super_ChConstraintThree).variables_c = mvariables_c;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] = 0.0;
              (this->Cq_a).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[0] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[1] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[2] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[3] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[4] = 0.0;
              (this->Cq_b).super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
              m_data.array[5] = 0.0;
              (this->Cq_c).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_1,_1,_1>_>.m_storage.
              m_data.array[0] = 0.0;
              return;
            }
          }
          __assert_fail("dynamic_cast<ChVariablesBody*>(mvariables_c)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintThreeBBShaft.cpp"
                        ,0x40,
                        "virtual void chrono::ChConstraintThreeBBShaft::SetVariables(ChVariables *, ChVariables *, ChVariables *)"
                       );
        }
      }
      __assert_fail("dynamic_cast<ChVariablesBody*>(mvariables_b)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintThreeBBShaft.cpp"
                    ,0x3f,
                    "virtual void chrono::ChConstraintThreeBBShaft::SetVariables(ChVariables *, ChVariables *, ChVariables *)"
                   );
    }
  }
  __assert_fail("dynamic_cast<ChVariablesBody*>(mvariables_a)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/solver/ChConstraintThreeBBShaft.cpp"
                ,0x3e,
                "virtual void chrono::ChConstraintThreeBBShaft::SetVariables(ChVariables *, ChVariables *, ChVariables *)"
               );
}

Assistant:

void ChConstraintThreeBBShaft::SetVariables(ChVariables* mvariables_a,
                                            ChVariables* mvariables_b,
                                            ChVariables* mvariables_c) {
    assert(dynamic_cast<ChVariablesBody*>(mvariables_a));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_b));
    assert(dynamic_cast<ChVariablesBody*>(mvariables_c));

    if (!mvariables_a || !mvariables_b || !mvariables_c) {
        SetValid(false);
        return;
    }

    SetValid(true);
    variables_a = mvariables_a;
    variables_b = mvariables_b;
    variables_c = mvariables_c;
    Cq_a.setZero();
    Cq_b.setZero();
    Cq_c.setZero();
}